

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderFailIfExtraTestcommentAfterBool::TestCharReaderFailIfExtraTestcommentAfterBool
          (TestCharReaderFailIfExtraTestcommentAfterBool *this)

{
  CharReaderFailIfExtraTest *in_RDI;
  
  CharReaderFailIfExtraTest::CharReaderFailIfExtraTest(in_RDI);
  (in_RDI->super_TestCase)._vptr_TestCase =
       (_func_int **)&PTR__TestCharReaderFailIfExtraTestcommentAfterBool_001b54b0;
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, commentAfterBool) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      " true /*trailing\ncomment*/";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT_STRING_EQUAL("", errs);
  JSONTEST_ASSERT_EQUAL(true, root.asBool());
  delete reader;
}